

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O2

action_class cached_stage_for_action(proto_action *act)

{
  action_value aVar1;
  
  aVar1 = act->action_type;
  if (((ulong)aVar1 < 0xc) && ((0xe7fU >> (aVar1 & 0x1f) & 1) != 0)) {
    return *(action_class *)(&DAT_0014c4c0 + (ulong)aVar1 * 4);
  }
  printf("Action_type in cached_stage_for_action is %d\n");
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/evp.c"
                ,0x554,"action_class cached_stage_for_action(proto_action *)");
}

Assistant:

static action_class
cached_stage_for_action(proto_action *act) {
    switch (act->action_type) {
    case Action_Congestion:
        return Congestion;
    case Action_Multi:
        return Immediate_and_Multi;
    case Action_Bridge:
        return Bridge;
    case Action_Terminal:
    case Action_Filter:
    case Action_Split:
    case Action_Immediate:
    case Action_Store:
    case Action_Thread_Bridge:
    case Action_NoAction:
        return Immediate;
    default:
	printf("Action_type in cached_stage_for_action is %d\n", act->action_type);
        assert(0);    
    }
    /*NOTREACHED*/
    return Immediate;
}